

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializationLayer.cpp
# Opt level: O2

void __thiscall SerializationLayer::handlePacket(SerializationLayer *this,Buffer *packet)

{
  _Vector_base<char,_std::allocator<char>_> _Stack_28;
  
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&_Stack_28,&packet->data);
  SynchronizedQueue<Buffer>::put(&this->packetQueue,(Buffer *)&_Stack_28);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&_Stack_28);
  return;
}

Assistant:

void SerializationLayer::handlePacket(Buffer packet) {
    packetQueue.put(packet);
}